

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getbyhandle(HSQUIRRELVM v,SQInteger idx,HSQMEMBERHANDLE *handle)

{
  SQRESULT SVar1;
  SQObjectPtr *val;
  SQObjectPtr *self;
  SQObjectPtr *in_stack_ffffffffffffff88;
  HSQUIRRELVM in_stack_ffffffffffffff90;
  SQVM *this;
  SQObjectPtr **in_stack_ffffffffffffffa0;
  HSQMEMBERHANDLE *in_stack_ffffffffffffffa8;
  SQObjectPtr *in_stack_ffffffffffffffb0;
  SQObjectValue in_stack_ffffffffffffffb8;
  SQWeakRef *local_30;
  SQCollectable *local_28;
  SQUnsignedInteger local_8;
  
  local_28 = (SQCollectable *)
             stack_get(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
  local_30 = (SQWeakRef *)0x0;
  SVar1 = _getmemberbyhandle((HSQUIRRELVM)in_stack_ffffffffffffffb8.pTable,in_stack_ffffffffffffffb0
                             ,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (SVar1 < 0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    this = (SQVM *)&stack0xffffffffffffffc0;
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)this,(SQObject *)&stack0xffffffffffffffb0);
    SQVM::Push(this,in_stack_ffffffffffffff88);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

SQRESULT sq_getbyhandle(HSQUIRRELVM v,SQInteger idx,const HSQMEMBERHANDLE *handle)
{
    SQObjectPtr &self = stack_get(v,idx);
    SQObjectPtr *val = NULL;
    if(SQ_FAILED(_getmemberbyhandle(v,self,handle,val))) {
        return SQ_ERROR;
    }
    v->Push(_realval(*val));
    return SQ_OK;
}